

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t err_code;
  size_t sVar1;
  size_t sVar2;
  unsigned_long_long uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  size_t err_code_1;
  undefined4 *dst_00;
  
  sVar1 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar1) {
    return sVar1;
  }
  if (cctx->stage == ZSTDcs_created) {
    sVar2 = 0xffffffffffffffc4;
  }
  else {
    dst_00 = (undefined4 *)((long)dst + sVar1);
    uVar5 = dstCapacity - sVar1;
    puVar4 = dst_00;
    if (cctx->stage == ZSTDcs_init) {
      sVar2 = ZSTD_writeFrameHeader(dst_00,uVar5,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar2) goto LAB_00152aeb;
      uVar5 = uVar5 - sVar2;
      cctx->stage = ZSTDcs_ongoing;
      puVar4 = (undefined4 *)(sVar2 + (long)dst_00);
    }
    if (cctx->stage != ZSTDcs_ending) {
      if (uVar5 < 4) {
        sVar2 = 0xffffffffffffffba;
        goto LAB_00152aeb;
      }
      *puVar4 = 1;
      puVar4 = (undefined4 *)((long)puVar4 + 3);
      uVar5 = uVar5 - 3;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      if (uVar5 < 4) {
        sVar2 = 0xffffffffffffffba;
        goto LAB_00152aeb;
      }
      uVar3 = ZSTD_XXH64_digest(&cctx->xxhState);
      *puVar4 = (int)uVar3;
      puVar4 = puVar4 + 1;
    }
    cctx->stage = ZSTDcs_created;
    sVar2 = (long)puVar4 - (long)dst_00;
  }
LAB_00152aeb:
  uVar5 = sVar2;
  if (sVar2 < 0xffffffffffffff89) {
    if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0))
    {
      __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x36bb,
                    "size_t ZSTD_compressEnd(ZSTD_CCtx *, void *, size_t, const void *, size_t)");
    }
    if ((cctx->pledgedSrcSizePlusOne == 0) ||
       (uVar5 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
      uVar5 = sVar2 + sVar1;
    }
  }
  return uVar5;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize);
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult);
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    return cSize + endResult;
}